

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_system_matrix.cc
# Opt level: O3

tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *
projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow
          (tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           *__return_storage_ptr__,shared_ptr<const_lf::mesh::Mesh> *mesh,DofHandler *dofh,
          function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
          *f,function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>
             *dirichlet_data,double sigma,QuadRule *quadrule,bool modified_penalty)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_type sVar7;
  pointer pTVar8;
  DofHandler *dof_handler_trial;
  bool bVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  Matrix<double,_2,_1,_0,_2,_1> *pMVar12;
  Entity *pEVar13;
  Scalar *pSVar14;
  undefined4 extraout_var_01;
  bool *pbVar15;
  undefined4 extraout_var_02;
  ostream *poVar16;
  long extraout_RDX;
  ulong uVar17;
  long lVar18;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  _Var19;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  _Var20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  VectorXd rhs;
  anon_class_16_2_b3f1b856 selector;
  COOMatrix<double> A;
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> dirichlet;
  AllCodimMeshDataSet<bool> boundary;
  PiecewiseConstElementVectorProvider elem_vec_builder;
  PiecewiseConstElementMatrixProvider elem_mat_builder;
  stringstream ss;
  string local_3c8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3a8;
  string local_390;
  string local_370;
  DofHandler *local_350;
  AllCodimMeshDataSet<bool> *local_348;
  COOMatrix<double> local_340;
  shared_ptr<const_lf::mesh::Mesh> local_320;
  QuadRule *local_310;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  *local_308;
  DofHandler *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_2d8;
  QuadRule local_2a0;
  AllCodimMeshDataSet<bool> local_270;
  PiecewiseConstElementVectorProvider local_238;
  PiecewiseConstElementMatrixProvider local_1d0;
  _Any_data local_1b8;
  double local_1a8 [47];
  undefined4 extraout_var_00;
  
  local_310 = quadrule;
  local_308 = f;
  lf::mesh::utils::flagEntitiesOnBoundary(&local_270,mesh);
  local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::CodimMeshDataSet
            (&local_2d8,&local_320,1);
  local_300 = dofh;
  if (local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_320.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar3 = (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar10 = (*peVar3->_vptr_Mesh[2])(peVar3,1);
  if (extraout_RDX != 0) {
    lVar21 = 0;
    do {
      if ((dirichlet_data->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_00167cce;
      }
      pEVar13 = *(Entity **)(CONCAT44(extraout_var,iVar10) + lVar21);
      (*dirichlet_data->_M_invoker)(&local_1b8,(Entity *)dirichlet_data);
      pMVar12 = lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator()
                          (&local_2d8,pEVar13);
      (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
      [0] = (double)local_1b8._M_unused._0_8_;
      (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
      [1] = (double)local_1b8._8_8_;
      lVar21 = lVar21 + 8;
    } while (extraout_RDX << 3 != lVar21);
  }
  dof_handler_trial = local_300;
  uVar11 = (*local_300->_vptr_DofHandler[2])(local_300);
  local_340.cols_ = (*dof_handler_trial->_vptr_DofHandler[2])(dof_handler_trial);
  local_340.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Triplet<double,_int> *)0x0;
  local_340.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Triplet<double,_int> *)0x0;
  local_340.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340.rows_ = uVar11;
  PiecewiseConstElementMatrixProvider::PiecewiseConstElementMatrixProvider
            (&local_1d0,sigma,&local_270.super_MeshDataSet<bool>,modified_penalty);
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_const_projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider>
            (0,dof_handler_trial,dof_handler_trial,&local_1d0,&local_340);
  uVar11 = (*dof_handler_trial->_vptr_DofHandler[2])(dof_handler_trial);
  local_238.sigma_ = 0.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_1b8,(ulong)uVar11,1,(scalar_constant_op<double> *)&local_238);
  local_3a8.m_storage.m_data = (double *)0x0;
  local_3a8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_3a8,local_1b8._M_unused._M_member_pointer,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3a8,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_1b8,(assign_op<double,_double> *)&local_238);
  auVar6 = _DAT_003f4080;
  auVar5 = _DAT_003f4070;
  if (0 < local_3a8.m_storage.m_rows) {
    uVar17 = local_3a8.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar23._8_4_ = (int)uVar17;
    auVar23._0_8_ = uVar17;
    auVar23._12_4_ = (int)(uVar17 >> 0x20);
    lVar21 = 0;
    auVar23 = auVar23 ^ _DAT_003f4080;
    do {
      auVar24._8_4_ = (int)lVar21;
      auVar24._0_8_ = lVar21;
      auVar24._12_4_ = (int)((ulong)lVar21 >> 0x20);
      auVar24 = (auVar24 | auVar5) ^ auVar6;
      if ((bool)(~(auVar24._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar24._0_4_ ||
                  auVar23._4_4_ < auVar24._4_4_) & 1)) {
        local_3a8.m_storage.m_data[lVar21] = local_1a8[0];
      }
      if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
          auVar24._12_4_ <= auVar23._12_4_) {
        local_3a8.m_storage.m_data[lVar21 + 1] = local_1a8[0];
      }
      lVar21 = lVar21 + 2;
    } while ((uVar17 - ((uint)(local_3a8.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 != lVar21
            );
  }
  std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  ::function((function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
              *)&local_2f8,local_308);
  lf::quad::QuadRule::QuadRule(&local_2a0,local_310);
  PiecewiseConstElementVectorProvider::PiecewiseConstElementVectorProvider
            (&local_238,sigma,
             (function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
              *)&local_2f8,&local_2a0,&local_270.super_MeshDataSet<bool>,
             &local_2d8.super_MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>);
  free(local_2a0.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_2a0.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
  }
  lf::assemble::
  AssembleVectorLocally<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_projects::ipdg_stokes::assemble::PiecewiseConstElementVectorProvider>
            (0,dof_handler_trial,&local_238,(Matrix<double,__1,_1,_0,__1,_1> *)&local_3a8);
  sVar7 = local_340.cols_;
  local_350 = dof_handler_trial;
  uVar17 = (ulong)local_340.cols_;
  local_348 = &local_270;
  if (local_340.rows_ != local_340.cols_) {
LAB_00167cce:
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Matrix must be square!",0x16);
    paVar1 = &local_3c8.field_2;
    local_3c8.field_2._M_allocated_capacity._0_4_ = 0x6f722e41;
    local_3c8.field_2._M_local_buf[4] = 'w';
    local_3c8.field_2._M_local_buf[5] = 's';
    local_3c8.field_2._M_allocated_capacity._6_2_ = 0x2928;
    local_3c8.field_2._8_5_ = 0x4e203d3d20;
    local_3c8._M_string_length = 0xd;
    local_3c8.field_2._M_local_buf[0xd] = '\0';
    paVar2 = &local_390.field_2;
    local_3c8._M_dataplus._M_p = (pointer)paVar1;
    local_390._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_3c8,&local_390,0x5a,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,
                      CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                               local_370.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != paVar2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c8._M_dataplus._M_p,
                      CONCAT26(local_3c8.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_3c8.field_2._M_local_buf[5],
                                        CONCAT14(local_3c8.field_2._M_local_buf[4],
                                                 local_3c8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_3c8.field_2._M_allocated_capacity._0_4_ = 0x736c6166;
    local_3c8.field_2._M_local_buf[4] = 'e';
    local_3c8.field_2._M_local_buf[5] = '\0';
    local_3c8._M_string_length = 5;
    local_3c8._M_dataplus._M_p = (pointer)paVar1;
    local_390._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    local_370._M_string_length = 0;
    local_370.field_2._M_local_buf[0] = '\0';
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    lf::base::AssertionFailed(&local_3c8,&local_390,0x5a,&local_370);
LAB_00167e1b:
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3c8);
    abort();
  }
  if (local_3a8.m_storage.m_rows != uVar17) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Mismatch N = ",0xd);
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," <-> b.size() = ",0x10);
    std::ostream::_M_insert<long>((long)poVar16);
    paVar1 = &local_3c8.field_2;
    local_3c8.field_2._M_allocated_capacity._0_4_ = 0x3d3d204e;
    local_3c8.field_2._M_local_buf[4] = ' ';
    local_3c8.field_2._M_local_buf[5] = 'b';
    local_3c8.field_2._M_allocated_capacity._6_2_ = 0x732e;
    local_3c8.field_2._8_5_ = 0x2928657a69;
    local_3c8._M_string_length = 0xd;
    local_3c8.field_2._M_local_buf[0xd] = '\0';
    paVar2 = &local_390.field_2;
    local_3c8._M_dataplus._M_p = (pointer)paVar1;
    local_390._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_3c8,&local_390,0x5c,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,
                      CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                               local_370.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != paVar2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c8._M_dataplus._M_p,
                      CONCAT26(local_3c8.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_3c8.field_2._M_local_buf[5],
                                        CONCAT14(local_3c8.field_2._M_local_buf[4],
                                                 local_3c8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_3c8.field_2._M_allocated_capacity._0_4_ = 0x736c6166;
    local_3c8.field_2._M_local_buf[4] = 'e';
    local_3c8.field_2._M_local_buf[5] = '\0';
    local_3c8._M_string_length = 5;
    local_3c8._M_dataplus._M_p = (pointer)paVar1;
    local_390._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    local_370._M_string_length = 0;
    local_370.field_2._M_local_buf[0] = '\0';
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    lf::base::AssertionFailed(&local_3c8,&local_390,0x5c,&local_370);
    goto LAB_00167e1b;
  }
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1b8,uVar17);
  if (uVar17 != 0) {
    uVar22 = 0;
    do {
      iVar10 = (*local_350->_vptr_DofHandler[7])(local_350,uVar22);
      pEVar13 = (Entity *)CONCAT44(extraout_var_00,iVar10);
      iVar10 = (*pEVar13->_vptr_Entity[4])(pEVar13);
      if ((char)iVar10 == '\x01') {
        lf::mesh::utils::AllCodimMeshDataSet<bool>::operator()(local_348,pEVar13);
      }
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           local_1b8._M_pod_data,uVar22);
      *pSVar14 = 0.0;
      uVar22 = uVar22 + 1;
    } while (uVar17 != uVar22);
  }
  lf::assemble::COOMatrix<double>::
  MatVecMult<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_340,-1.0,(Matrix<double,__1,_1,_0,__1,_1> *)&local_1b8,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_3a8);
  free(local_1b8._M_unused._M_object);
  if (sVar7 != 0) {
    uVar22 = 0;
    do {
      iVar10 = (*local_350->_vptr_DofHandler[7])(local_350,uVar22);
      pEVar13 = (Entity *)CONCAT44(extraout_var_01,iVar10);
      iVar10 = (*pEVar13->_vptr_Entity[4])(pEVar13);
      if (((char)iVar10 == '\x01') &&
         (pbVar15 = lf::mesh::utils::AllCodimMeshDataSet<bool>::operator()(local_348,pEVar13),
         *pbVar15 == true)) {
        pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &local_3a8,uVar22);
        *pSVar14 = 0.0;
      }
      uVar22 = uVar22 + 1;
    } while (uVar17 != uVar22);
  }
  pTVar8 = local_340.triplets_.
           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_3c8._M_dataplus._M_p = (pointer)&local_350;
  lVar21 = (long)local_340.triplets_.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_340.triplets_.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  _Var19._M_current =
       local_340.triplets_.
       super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8._M_unused._M_object = local_3c8._M_dataplus._M_p;
  if (0 < lVar21 >> 6) {
    lVar18 = (lVar21 >> 6) + 1;
    do {
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_1b8._M_pod_data,_Var19);
      _Var20._M_current = _Var19._M_current;
      if (bVar9) goto LAB_00167b34;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_1b8._M_pod_data,_Var19._M_current + 1);
      _Var20._M_current = _Var19._M_current + 1;
      if (bVar9) goto LAB_00167b34;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_1b8._M_pod_data,_Var19._M_current + 2);
      _Var20._M_current = _Var19._M_current + 2;
      if (bVar9) goto LAB_00167b34;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_1b8._M_pod_data,_Var19._M_current + 3);
      _Var20._M_current = _Var19._M_current + 3;
      if (bVar9) goto LAB_00167b34;
      _Var19._M_current = _Var19._M_current + 4;
      lVar18 = lVar18 + -1;
      lVar21 = lVar21 + -0x40;
    } while (1 < lVar18);
  }
  lVar21 = lVar21 >> 4;
  if (lVar21 == 1) {
LAB_00167b1b:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_1b8._M_pod_data,_Var19);
    _Var20._M_current = _Var19._M_current;
    if (!bVar9) {
      _Var20._M_current = pTVar8;
    }
  }
  else if (lVar21 == 2) {
LAB_00167af8:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_1b8._M_pod_data,_Var19);
    _Var20._M_current = _Var19._M_current;
    if (!bVar9) {
      _Var19._M_current = _Var19._M_current + 1;
      goto LAB_00167b1b;
    }
  }
  else {
    _Var20._M_current = pTVar8;
    if (lVar21 != 3) goto LAB_00167b7d;
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_1b8._M_pod_data,_Var19);
    _Var20._M_current = _Var19._M_current;
    if (!bVar9) {
      _Var19._M_current = _Var19._M_current + 1;
      goto LAB_00167af8;
    }
  }
LAB_00167b34:
  _Var19._M_current = _Var20._M_current + 1;
  if (_Var19._M_current != pTVar8 && _Var20._M_current != pTVar8) {
    do {
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)&local_3c8,_Var19);
      if (!bVar9) {
        iVar10 = (_Var19._M_current)->m_col;
        dVar4 = (_Var19._M_current)->m_value;
        (_Var20._M_current)->m_row = (_Var19._M_current)->m_row;
        (_Var20._M_current)->m_col = iVar10;
        (_Var20._M_current)->m_value = dVar4;
        _Var20._M_current = _Var20._M_current + 1;
      }
      _Var19._M_current = _Var19._M_current + 1;
    } while (_Var19._M_current != pTVar8);
  }
LAB_00167b7d:
  if (_Var20._M_current !=
      local_340.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_340.triplets_.
    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = _Var20._M_current;
  }
  if (sVar7 != 0) {
    uVar22 = 0;
    do {
      iVar10 = (*local_350->_vptr_DofHandler[7])(local_350,uVar22);
      pEVar13 = (Entity *)CONCAT44(extraout_var_02,iVar10);
      iVar10 = (*pEVar13->_vptr_Entity[4])(pEVar13);
      if (((char)iVar10 == '\x01') &&
         (pbVar15 = lf::mesh::utils::AllCodimMeshDataSet<bool>::operator()(local_348,pEVar13),
         *pbVar15 == true)) {
        lf::assemble::COOMatrix<double>::AddToEntry(&local_340,uVar22,uVar22,1.0);
      }
      uVar22 = uVar22 + 1;
    } while (uVar17 != uVar22);
  }
  std::_Tuple_impl<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,-1,1,0,-1,1>>::
  _Tuple_impl<lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&,void>
            ((_Tuple_impl<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>> *)
             __return_storage_ptr__,&local_340,(Matrix<double,__1,_1,_0,__1,_1> *)&local_3a8);
  free(local_238.quadrule_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_238.quadrule_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_data);
  if (local_238.f_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_238.f_.super__Function_base._M_manager)
              ((_Any_data *)&local_238.f_,(_Any_data *)&local_238.f_,__destroy_functor);
  }
  free(local_3a8.m_storage.m_data);
  if (local_340.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (Triplet<double,_int> *)0x0) {
    operator_delete(local_340.triplets_.
                    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_2d8.super_MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>._vptr_MeshDataSet =
       (_func_int **)&PTR_operator___004cfee0;
  if (local_2d8.data_.m_holder.m_capacity != 0) {
    operator_delete(local_2d8.data_.m_holder.m_start,local_2d8.data_.m_holder.m_capacity << 4);
  }
  if (local_2d8.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d8.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  lf::mesh::utils::AllCodimMeshDataSet<bool>::~AllCodimMeshDataSet(&local_270);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<lf::assemble::COOMatrix<double>, Eigen::VectorXd>
buildSystemMatrixNoFlow(
    const std::shared_ptr<const lf::mesh::Mesh> &mesh,
    const lf::assemble::DofHandler &dofh,
    const std::function<Eigen::Vector2d(const Eigen::Vector2d &)> &f,
    const std::function<Eigen::Vector2d(const lf::mesh::Entity &)>
        &dirichlet_data,
    double sigma, const lf::quad::QuadRule &quadrule, bool modified_penalty) {
  // Compute the boundary elements
  const auto boundary = lf::mesh::utils::flagEntitiesOnBoundary(mesh);
  // Compute the dirichlet data
  auto dirichlet = lf::mesh::utils::CodimMeshDataSet<Eigen::Vector2d>(mesh, 1);
  for (const auto *ep : mesh->Entities(1)) {
    dirichlet(*ep) = dirichlet_data(*ep);
  }
  // Assemble the system matrix
  lf::assemble::COOMatrix<double> A(dofh.NumDofs(), dofh.NumDofs());
  const auto elem_mat_builder =
      projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider(
          sigma, boundary, modified_penalty);
  lf::assemble::AssembleMatrixLocally(0, dofh, dofh, elem_mat_builder, A);
  // Assemble the right hand side
  Eigen::VectorXd rhs = Eigen::VectorXd::Zero(dofh.NumDofs());
  const auto elem_vec_builder =
      projects::ipdg_stokes::assemble::PiecewiseConstElementVectorProvider(
          sigma, f, quadrule, boundary, dirichlet);
  lf::assemble::AssembleVectorLocally(0, dofh, elem_vec_builder, rhs);

  // Enforce no-flow boundary conditions
  auto selector = [&](lf::base::size_type idx) -> std::pair<bool, double> {
    const auto &e = dofh.Entity(idx);
    return {e.RefEl() == lf::base::RefElType::kPoint && boundary(e), 0};
  };
  lf::assemble::FixFlaggedSolutionComponents(selector, A, rhs);

  // Return the computed LSE
  return {A, rhs};
}